

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O0

UniformCollection *
deqp::gles31::Functional::anon_unknown_1::UniformCollection::basicArray
          (DataType type,char *nameSuffix)

{
  bool bVar1;
  UniformCollection *pUVar2;
  char *name_;
  VarType local_e0;
  VarType local_c8;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  Uniform local_68;
  Precision local_30;
  Precision prec;
  UniformCollection *local_20;
  UniformCollection *res;
  char *nameSuffix_local;
  DataType type_local;
  
  res = (UniformCollection *)nameSuffix;
  nameSuffix_local._4_4_ = type;
  pUVar2 = (UniformCollection *)operator_new(0x30);
  UniformCollection(pUVar2);
  local_20 = pUVar2;
  bVar1 = glu::isDataTypeBoolOrBVec(nameSuffix_local._4_4_);
  pUVar2 = local_20;
  local_30 = bVar1 + 1 + (uint)bVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"u_var",&local_a9);
  std::operator+(&local_88,&local_a8,(char *)res);
  name_ = (char *)std::__cxx11::string::c_str();
  glu::VarType::VarType(&local_e0,nameSuffix_local._4_4_,local_30);
  glu::VarType::VarType(&local_c8,&local_e0,3);
  Uniform::Uniform(&local_68,name_,&local_c8);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
  ::push_back(&pUVar2->m_uniforms,&local_68);
  Uniform::~Uniform(&local_68);
  glu::VarType::~VarType(&local_c8);
  glu::VarType::~VarType(&local_e0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  return local_20;
}

Assistant:

static UniformCollection* basicArray (const glu::DataType type, const char* const nameSuffix = "")
	{
		UniformCollection* const	res		= new UniformCollection;
		const glu::Precision		prec	= glu::isDataTypeBoolOrBVec(type) ? glu::PRECISION_LAST : glu::PRECISION_MEDIUMP;
		res->m_uniforms.push_back(Uniform((string("u_var") + nameSuffix).c_str(), glu::VarType(glu::VarType(type, prec), 3)));
		return res;
	}